

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_wait_ms(int timeout_ms)

{
  int *piVar1;
  long lVar2;
  timeval older;
  timeval newer;
  int local_2c;
  int r;
  int error;
  int pending_ms;
  timeval initial_tv;
  int timeout_ms_local;
  
  if (timeout_ms == 0) {
    initial_tv.tv_usec._4_4_ = 0;
  }
  else if (timeout_ms < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    initial_tv.tv_usec._4_4_ = -1;
  }
  else {
    older = curlx_tvnow();
    r = timeout_ms;
    do {
      local_2c = poll((pollfd *)0x0,0,r);
      if (local_2c != -1) goto LAB_008eb8fd;
      piVar1 = __errno_location();
      if ((*piVar1 != 0) && ((Curl_ack_eintr != 0 || (*piVar1 != 4)))) goto LAB_008eb8fd;
      newer = curlx_tvnow();
      lVar2 = curlx_tvdiff(newer,older);
      r = timeout_ms - (int)lVar2;
    } while (0 < r);
    local_2c = 0;
LAB_008eb8fd:
    if (local_2c != 0) {
      local_2c = -1;
    }
    initial_tv.tv_usec._4_4_ = local_2c;
  }
  return initial_tv.tv_usec._4_4_;
}

Assistant:

int Curl_wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
  int error;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = curlx_tvnow();
  do {
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    pending_ms = timeout_ms - elapsed_ms;
    if(pending_ms <= 0) {
      r = 0;  /* Simulate a "call timed out" case */
      break;
    }
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}